

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

void __thiscall QList<QTzTransition>::QList(QList<QTzTransition> *this,qsizetype size)

{
  QArrayDataPointer<QTzTransition> *in_RSI;
  QArrayDataPointer<QTzTransition> *in_RDI;
  QArrayDataPointer<QTzTransition> *unaff_retaddr;
  undefined4 in_stack_ffffffffffffffe8;
  AllocationOption in_stack_ffffffffffffffec;
  
  QArrayDataPointer<QTzTransition>::QArrayDataPointer
            (unaff_retaddr,(qsizetype)in_RDI,(qsizetype)in_RSI,in_stack_ffffffffffffffec);
  if (in_RSI != (QArrayDataPointer<QTzTransition> *)0x0) {
    QArrayDataPointer<QTzTransition>::operator->(in_RDI);
    QArrayDataPointer<QTzTransition>::appendInitialize
              (in_RSI,CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8));
  }
  return;
}

Assistant:

explicit QList(qsizetype size)
        : d(size)
    {
        if (size)
            d->appendInitialize(size);
    }